

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::vector<pbrt::LightBounds,_pstd::pmr::polymorphic_allocator<pbrt::LightBounds>_>::reserve
          (vector<pbrt::LightBounds,_pstd::pmr::polymorphic_allocator<pbrt::LightBounds>_> *this,
          size_t n)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  LightBounds *pLVar10;
  long lVar11;
  int i;
  ulong uVar12;
  
  if (this->nAlloc < n) {
    pLVar10 = pmr::polymorphic_allocator<pbrt::LightBounds>::allocate_object<pbrt::LightBounds>
                        (&this->alloc,n);
    lVar11 = 0;
    for (uVar12 = 0; uVar12 < this->nStored; uVar12 = uVar12 + 1) {
      puVar1 = (undefined8 *)
               ((long)&(this->ptr->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x + lVar11);
      uVar3 = *puVar1;
      uVar4 = puVar1[1];
      uVar5 = puVar1[2];
      uVar6 = puVar1[3];
      puVar1 = (undefined8 *)
               ((long)&(this->ptr->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z + lVar11);
      uVar7 = puVar1[1];
      uVar8 = puVar1[2];
      uVar9 = puVar1[3];
      puVar2 = (undefined8 *)
               ((long)&(pLVar10->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z + lVar11);
      *puVar2 = *puVar1;
      puVar2[1] = uVar7;
      puVar2[2] = uVar8;
      puVar2[3] = uVar9;
      puVar1 = (undefined8 *)
               ((long)&(pLVar10->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x + lVar11);
      *puVar1 = uVar3;
      puVar1[1] = uVar4;
      puVar1[2] = uVar5;
      puVar1[3] = uVar6;
      lVar11 = lVar11 + 0x34;
    }
    pmr::polymorphic_allocator<pbrt::LightBounds>::deallocate_object<pbrt::LightBounds>
              (&this->alloc,this->ptr,this->nAlloc);
    this->nAlloc = n;
    this->ptr = pLVar10;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }